

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicornafl.cpp
# Opt level: O2

uc_err dummy_uc_afl_fuzz_callback(uc_engine *uc,void *data)

{
  uc_err uVar1;
  undefined8 uStack_30;
  uint64_t pc;
  uc_mode mode;
  uc_arch arch;
  uint64_t cpsr;
  
  pc = 0;
  uc_ctl(uc,0x84000002,&arch);
  uc_ctl(uc,0x84000000,&mode);
  switch(arch) {
  case UC_ARCH_ARM:
    cpsr = 0;
    uc_reg_read(uc,0xb,&pc);
    uc_reg_read(uc,3,&cpsr);
    if ((cpsr & 0x20) != 0) {
      pc = pc | 1;
    }
    goto switchD_0010286e_default;
  case UC_ARCH_ARM64:
    uStack_30 = 0x104;
    break;
  case UC_ARCH_MIPS:
  case UC_ARCH_PPC:
    uStack_30 = 1;
    break;
  case UC_ARCH_X86:
    if (mode == UC_MODE_16) {
      uStack_30 = 0x22;
    }
    else if (mode == UC_MODE_32) {
      uStack_30 = 0x1a;
    }
    else {
      uStack_30 = 0x29;
    }
    break;
  case UC_ARCH_SPARC:
    uStack_30 = 0x58;
    break;
  case UC_ARCH_M68K:
    uStack_30 = 0x12;
    break;
  case UC_ARCH_RISCV:
    uStack_30 = 0xbe;
    break;
  case UC_ARCH_S390X:
    uStack_30 = 0x41;
    break;
  case UC_ARCH_TRICORE:
    uStack_30 = 0x28;
    break;
  default:
    goto switchD_0010286e_default;
  }
  uc_reg_read(uc,uStack_30,&pc);
switchD_0010286e_default:
  uVar1 = uc_emu_start(uc,pc,0,0,0);
  return uVar1;
}

Assistant:

static uc_err dummy_uc_afl_fuzz_callback(uc_engine* uc, void* data) {
    uint64_t pc;

    pc = uc_get_pc(uc);

    // Note the multiple exits is enabled in this case.
    return uc_emu_start(uc, pc, 0, 0, 0);
}